

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::ExtensionRangeOptions_Declaration::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  Nullable<const_char_*> failure_msg;
  Arena *pAVar4;
  ExtensionRangeOptions_Declaration *_this;
  ExtensionRangeOptions_Declaration *local_28;
  MessageLite *local_20 [2];
  
  local_28 = (ExtensionRangeOptions_Declaration *)to_msg;
  local_20[0] = from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::ExtensionRangeOptions_Declaration_const*,google::protobuf::ExtensionRangeOptions_Declaration*>
                          ((ExtensionRangeOptions_Declaration **)local_20,&local_28,"&from != _this"
                          );
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x12d2,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_20)
    ;
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 0x1f) != 0) {
    if ((uVar1 & 1) != 0) {
      uVar2 = from_msg[1]._internal_metadata_.ptr_;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 1;
      pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.full_name_,(string *)(uVar2 & 0xfffffffffffffffc),
                 pAVar4);
    }
    if ((uVar1 & 2) != 0) {
      pp_Var3 = from_msg[2]._vptr_MessageLite;
      (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
           (local_28->field_0)._impl_._has_bits_.has_bits_[0] | 2;
      pAVar4 = (Arena *)(local_28->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if (((ulong)pAVar4 & 1) != 0) {
        pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
      }
      internal::ArenaStringPtr::Set<>
                (&(local_28->field_0)._impl_.type_,(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                 pAVar4);
    }
    if ((uVar1 & 4) != 0) {
      *(int *)((long)&local_28->field_0 + 0x18) = (int)from_msg[2]._internal_metadata_.ptr_;
    }
    if ((uVar1 & 8) != 0) {
      (local_28->field_0)._impl_.reserved_ =
           *(bool *)((long)&from_msg[2]._internal_metadata_.ptr_ + 4);
    }
    if ((uVar1 & 0x10) != 0) {
      (local_28->field_0)._impl_.repeated_ =
           *(bool *)((long)&from_msg[2]._internal_metadata_.ptr_ + 5);
    }
  }
  (local_28->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_28->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_28->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void ExtensionRangeOptions_Declaration::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<ExtensionRangeOptions_Declaration*>(&to_msg);
  auto& from = static_cast<const ExtensionRangeOptions_Declaration&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.ExtensionRangeOptions.Declaration)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000001fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_full_name(from._internal_full_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_type(from._internal_type());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.reserved_ = from._impl_.reserved_;
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_impl_.repeated_ = from._impl_.repeated_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}